

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::SetIntegrationRule
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this,int int_order)

{
  TPZGeoEl *pTVar1;
  long in_RDI;
  TPZManVector<int,_3> ord;
  int dim;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  TPZCompEl *in_stack_ffffffffffffffb8;
  TPZInt1d *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  TPZManVector<int,_3> *in_stack_ffffffffffffffe0;
  
  pTVar1 = TPZCompEl::Reference(in_stack_ffffffffffffffb8);
  (**(code **)(*(long *)pTVar1 + 0x210))();
  TPZManVector<int,_3>::TPZManVector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (*(long *)(in_RDI + 0x20) == 0) {
    TPZInt1d::SetOrder(in_stack_ffffffffffffffc0,(TPZVec<int> *)in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffb4);
  }
  else {
    (**(code **)(**(long **)(in_RDI + 0x20) + 0x28))
              (*(long **)(in_RDI + 0x20),&stack0xffffffffffffffc0,0);
  }
  TPZManVector<int,_3>::~TPZManVector
            ((TPZManVector<int,_3> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::SetIntegrationRule(int int_order) {
    
#ifdef PZDEBUG
    if (!this->Reference()) {
        DebugStop();
    }
#endif
    int dim = this->Reference()->Dimension();
    TPZManVector<int,3> ord(dim,int_order);
    if (TPZCompEl::fIntegrationRule) {
        TPZCompEl::fIntegrationRule->SetOrder(ord);
    }else{
        fIntRule.SetOrder(ord);
    }
    
}